

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void JSON::writeArrayItem(Pipeline *p,bool *first,JSON *element,size_t depth)

{
  size_t __n;
  size_t depth_local;
  JSON *element_local;
  bool *first_local;
  Pipeline *p_local;
  
  __n = depth;
  writeNext(p,first,depth);
  write(element,(int)p,(void *)depth,__n);
  return;
}

Assistant:

void
JSON::writeArrayItem(Pipeline* p, bool& first, JSON const& element, size_t depth)
{
    writeNext(p, first, depth);
    element.write(p, depth);
}